

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio_util.c
# Opt level: O0

int ImgIoUtilReadFile(char *file_name,uint8_t **data,size_t *data_size)

{
  int iVar1;
  FILE *__stream;
  ulong __size;
  uint8_t *__ptr;
  size_t sVar2;
  size_t *in_RDX;
  uint8_t **in_RSI;
  char *in_RDI;
  bool bVar3;
  int from_stdin;
  FILE *in;
  size_t file_size;
  uint8_t *file_data;
  int ok;
  int local_4;
  
  bVar3 = true;
  if (in_RDI != (char *)0x0) {
    iVar1 = strcmp(in_RDI,"-");
    bVar3 = iVar1 == 0;
  }
  if (bVar3) {
    local_4 = ImgIoUtilReadFromStdin(in_RSI,in_RDX);
  }
  else if ((in_RSI == (uint8_t **)0x0) || (in_RDX == (size_t *)0x0)) {
    local_4 = 0;
  }
  else {
    *in_RSI = (uint8_t *)0x0;
    *in_RDX = 0;
    __stream = fopen(in_RDI,"rb");
    if (__stream == (FILE *)0x0) {
      fprintf(stderr,"cannot open input file \'%s\'\n",in_RDI);
      local_4 = 0;
    }
    else {
      fseek(__stream,0,2);
      __size = ftell(__stream);
      if (__size == 0xffffffffffffffff) {
        fclose(__stream);
        fprintf(stderr,"error getting size of \'%s\'\n",in_RDI);
        local_4 = 0;
      }
      else {
        fseek(__stream,0,0);
        __ptr = (uint8_t *)WebPMalloc(0x108403);
        if (__ptr == (uint8_t *)0x0) {
          fclose(__stream);
          fprintf(stderr,"memory allocation failure when reading file %s\n",in_RDI);
          local_4 = 0;
        }
        else {
          sVar2 = fread(__ptr,__size,1,__stream);
          fclose(__stream);
          if (sVar2 == 1) {
            __ptr[__size] = '\0';
            *in_RSI = __ptr;
            *in_RDX = __size;
            local_4 = 1;
          }
          else {
            fprintf(stderr,"Could not read %d bytes of data from file %s\n",__size & 0xffffffff,
                    in_RDI);
            WebPFree((void *)0x1084ac);
            local_4 = 0;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int ImgIoUtilReadFile(const char* const file_name,
                      const uint8_t** data, size_t* data_size) {
  int ok;
  uint8_t* file_data;
  size_t file_size;
  FILE* in;
  const int from_stdin = (file_name == NULL) || !WSTRCMP(file_name, "-");

  if (from_stdin) return ImgIoUtilReadFromStdin(data, data_size);

  if (data == NULL || data_size == NULL) return 0;
  *data = NULL;
  *data_size = 0;

  in = WFOPEN(file_name, "rb");
  if (in == NULL) {
    WFPRINTF(stderr, "cannot open input file '%s'\n", (const W_CHAR*)file_name);
    return 0;
  }
  fseek(in, 0, SEEK_END);
  file_size = ftell(in);
  if (file_size == (size_t)-1) {
    fclose(in);
    WFPRINTF(stderr, "error getting size of '%s'\n", (const W_CHAR*)file_name);
    return 0;
  }
  fseek(in, 0, SEEK_SET);
  // we allocate one extra byte for the \0 terminator
  file_data = (uint8_t*)WebPMalloc(file_size + 1);
  if (file_data == NULL) {
    fclose(in);
    WFPRINTF(stderr, "memory allocation failure when reading file %s\n",
             (const W_CHAR*)file_name);
    return 0;
  }
  ok = (fread(file_data, file_size, 1, in) == 1);
  fclose(in);

  if (!ok) {
    WFPRINTF(stderr, "Could not read %d bytes of data from file %s\n",
             (int)file_size, (const W_CHAR*)file_name);
    WebPFree(file_data);
    return 0;
  }
  file_data[file_size] = '\0';  // convenient 0-terminator
  *data = file_data;
  *data_size = file_size;
  return 1;
}